

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_jump
          (irGenerator *this,JumpInstructionKind kind,LabelId bbTrue,LabelId bbFalse,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *condRetName,JumpKind jumpKind)

{
  LabelId LVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  JumpInstruction *__p;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_00;
  bool bVar3;
  int local_e0;
  uint32_t local_dc;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;
  undefined1 local_c0 [24];
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  jumpInst.super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  jumpInst.super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar3 = (condRetName->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true;
  if (bVar3) {
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(condRetName);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_58,pbVar2);
    local_dc = LeftValueToLabelId(this,(LeftVal *)&local_58);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
  }
  LVar1 = bbFalse;
  if (kind == Return) {
    bbTrue = this->_ReturnBlockLabelId;
    jumpKind = Undefined;
    kind = Br;
    local_e0 = -1;
    LVar1 = -1;
    if (bVar3) {
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string_const&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_80,&this->_ReturnVarName
                );
      pbVar2 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(condRetName);
      std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
      _Variant_storage<2ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,int,std::__cxx11::string> *)&local_a8,pbVar2);
      ir_assign(this,(LeftVal *)&local_80,(RightVal *)&local_a8);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_a8);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_80);
      bVar3 = false;
      jumpKind = Undefined;
      LVar1 = local_e0;
    }
  }
  local_e0 = LVar1;
  __p = (JumpInstruction *)operator_new(0x38);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001db418;
  __p->kind = kind;
  if (bVar3) {
    (__p->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    (__p->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_dc;
  }
  (__p->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::VarId>._M_engaged = bVar3;
  __p->bb_true = bbTrue;
  __p->bb_false = local_e0;
  __p->jump_kind = jumpKind;
  std::__shared_ptr<mir::inst::JumpInstruction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::JumpInstruction,void>
            ((__shared_ptr<mir::inst::JumpInstruction,(__gnu_cxx::_Lock_policy)2> *)local_c0,__p);
  std::__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&jumpInst.super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  this_00 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::
  variant<std::shared_ptr<mir::inst::JumpInstruction>&,void,void,std::shared_ptr<mir::inst::JumpInstruction>,void>
            ((variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
              *)local_c0,&jumpInst);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_00,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_c0);
  std::__detail::__variant::
  _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&jumpInst.super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void irGenerator::ir_jump(mir::inst::JumpInstructionKind kind, LabelId bbTrue,
                          LabelId bbFalse, std::optional<string> condRetName,
                          mir::inst::JumpKind jumpKind) {
  std::optional<VarId> crn;
  shared_ptr<mir::inst::JumpInstruction> jumpInst;

  if (condRetName.has_value()) {
    crn = VarId(LeftValueToLabelId(condRetName.value()));
  } else {
    crn = std::nullopt;
  }

  if (kind == mir::inst::JumpInstructionKind::Return) {
    kind = mir::inst::JumpInstructionKind::Br;
    bbTrue = _ReturnBlockLabelId;
    bbFalse = -1;
    if (crn.has_value()) {
      ir_assign(_ReturnVarName, condRetName.value());
      crn.reset();
    }
    jumpKind = mir::inst::JumpKind::Undefined;
  }

  jumpInst = shared_ptr<mir::inst::JumpInstruction>(
      new mir::inst::JumpInstruction(kind, bbTrue, bbFalse, crn, jumpKind));

  _funcNameToInstructions[_funcStack.back()].push_back(jumpInst);
}